

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

void __thiscall Assembler::writeAll(Assembler *this)

{
  pointer paVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  type_info *ptVar5;
  Error *this_00;
  pointer pvVar6;
  Assembler *pAVar7;
  pointer pvVar8;
  int i;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  int i_1;
  string function_name;
  string local_50;
  
  poVar4 = std::operator<<(this->_wtr,".constants:");
  std::operator<<(poVar4,'\n');
  lVar9 = 0;
  uVar11 = 0;
  do {
    paVar1 = (this->_consts).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->_consts).super__Vector_base<std::any,_std::allocator<std::any>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)paVar1 >> 4) <= uVar11) {
      poVar4 = std::operator<<(this->_wtr,".start:");
      std::operator<<(poVar4,'\n');
      lVar9 = 0;
      for (uVar11 = 0;
          uVar11 < (ulong)((long)(this->_startInstructions).
                                 super__Vector_base<Instruction,_std::allocator<Instruction>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->_startInstructions).
                                 super__Vector_base<Instruction,_std::allocator<Instruction>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 4); uVar11 = uVar11 + 1
          ) {
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)this->_wtr,(int)uVar11);
        pAVar7 = (Assembler *)0x9;
        poVar4 = std::operator<<(poVar4,'\t');
        instructionToAssembly_abi_cxx11_
                  (&function_name,pAVar7,
                   (Instruction *)
                   ((long)&((this->_startInstructions).
                            super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
                            super__Vector_impl_data._M_start)->_opr + lVar9));
        poVar4 = std::operator<<(poVar4,(string *)&function_name);
        std::operator<<(poVar4,'\n');
        std::__cxx11::string::~string((string *)&function_name);
        lVar9 = lVar9 + 0x10;
      }
      poVar4 = std::operator<<(this->_wtr,".functions:");
      std::operator<<(poVar4,'\n');
      uVar11 = 0;
      while( true ) {
        pvVar8 = (this->_instructions).
                 super__Vector_base<std::vector<Instruction,_std::allocator<Instruction>_>,_std::allocator<std::vector<Instruction,_std::allocator<Instruction>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar6 = (this->_instructions).
                 super__Vector_base<std::vector<Instruction,_std::allocator<Instruction>_>,_std::allocator<std::vector<Instruction,_std::allocator<Instruction>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((ulong)(((long)pvVar6 - (long)pvVar8) / 0x18) <= uVar11) break;
        std::any_cast<std::__cxx11::string>
                  (&function_name,
                   (this->_consts).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
                   super__Vector_impl_data._M_start +
                   (this->_functionNameConstant).super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar11]);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)this->_wtr,(int)uVar11);
        poVar4 = std::operator<<(poVar4,'\t');
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)poVar4,
                            (this->_functionNameConstant).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar11]);
        poVar4 = std::operator<<(poVar4,'\t');
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
        ::operator[](&this->_functionParameter,&function_name);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::operator<<(poVar4,"\t1\n");
        std::__cxx11::string::~string((string *)&function_name);
        uVar11 = uVar11 + 1;
      }
      for (uVar11 = 0; uVar11 < (ulong)(((long)pvVar6 - (long)pvVar8) / 0x18); uVar11 = uVar11 + 1)
      {
        poVar4 = std::operator<<(this->_wtr,".F");
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,(int)uVar11);
        poVar4 = std::operator<<(poVar4,":\t#");
        std::any_cast<std::__cxx11::string>
                  (&function_name,
                   (this->_consts).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
                   super__Vector_impl_data._M_start +
                   (this->_functionNameConstant).super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar11]);
        poVar4 = std::operator<<(poVar4,(string *)&function_name);
        std::operator<<(poVar4,'\n');
        std::__cxx11::string::~string((string *)&function_name);
        lVar9 = 0;
        for (uVar10 = 0;
            pvVar8 = (this->_instructions).
                     super__Vector_base<std::vector<Instruction,_std::allocator<Instruction>_>,_std::allocator<std::vector<Instruction,_std::allocator<Instruction>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
            uVar10 < (ulong)((long)*(pointer *)
                                    ((long)&pvVar8[uVar11].
                                            super__Vector_base<Instruction,_std::allocator<Instruction>_>
                                            ._M_impl.super__Vector_impl_data + 8) -
                             *(long *)&pvVar8[uVar11].
                                       super__Vector_base<Instruction,_std::allocator<Instruction>_>
                                       ._M_impl.super__Vector_impl_data >> 4); uVar10 = uVar10 + 1)
        {
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)this->_wtr,(int)uVar10);
          pAVar7 = (Assembler *)0x9;
          poVar4 = std::operator<<(poVar4,'\t');
          instructionToAssembly_abi_cxx11_
                    (&function_name,pAVar7,
                     (Instruction *)
                     (*(long *)&(this->_instructions).
                                super__Vector_base<std::vector<Instruction,_std::allocator<Instruction>_>,_std::allocator<std::vector<Instruction,_std::allocator<Instruction>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar11].
                                super__Vector_base<Instruction,_std::allocator<Instruction>_>.
                                _M_impl.super__Vector_impl_data + lVar9));
          poVar4 = std::operator<<(poVar4,(string *)&function_name);
          std::operator<<(poVar4,'\n');
          std::__cxx11::string::~string((string *)&function_name);
          lVar9 = lVar9 + 0x10;
        }
        pvVar6 = (this->_instructions).
                 super__Vector_base<std::vector<Instruction,_std::allocator<Instruction>_>,_std::allocator<std::vector<Instruction,_std::allocator<Instruction>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      return;
    }
    ptVar5 = std::any::type((any *)((long)&paVar1->_M_manager + lVar9));
    bVar2 = std::type_info::operator==(ptVar5,(type_info *)&int::typeinfo);
    if (bVar2) {
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)this->_wtr,(int)uVar11);
      poVar4 = std::operator<<(poVar4,"\tI\t");
      iVar3 = std::any_cast<int>((any *)((long)&((this->_consts).
                                                 super__Vector_base<std::any,_std::allocator<std::any>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                                _M_manager + lVar9));
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar3);
      std::operator<<(poVar4,'\n');
    }
    else {
      ptVar5 = std::any::type((any *)((long)&((this->_consts).
                                              super__Vector_base<std::any,_std::allocator<std::any>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->_M_manager
                                     + lVar9));
      bVar2 = std::type_info::operator==(ptVar5,(type_info *)&std::__cxx11::string::typeinfo);
      if (!bVar2) {
        this_00 = (Error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"Unvalid typeid",(allocator<char> *)&function_name);
        Error::Error(this_00,&local_50);
        __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
      }
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)this->_wtr,(int)uVar11);
      poVar4 = std::operator<<(poVar4,"\tS\t\"");
      std::any_cast<std::__cxx11::string>
                (&function_name,
                 (any *)((long)&((this->_consts).
                                 super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
                                 super__Vector_impl_data._M_start)->_M_manager + lVar9));
      poVar4 = std::operator<<(poVar4,(string *)&function_name);
      std::operator<<(poVar4,"\"\n");
      std::__cxx11::string::~string((string *)&function_name);
    }
    uVar11 = uVar11 + 1;
    lVar9 = lVar9 + 0x10;
  } while( true );
}

Assistant:

void Assembler::writeAll() {
	//const
	_wtr << ".constants:" << '\n';
	for (int i = 0; i < _consts.size(); i++) {
		if (_consts[i].type() == typeid(int)) {
			_wtr << i << "\tI\t" << std::any_cast<int>(_consts[i]) << '\n';
		}
		else if (_consts[i].type() == typeid(std::string)) {
			_wtr << i << "\tS\t\"" << std::any_cast<std::string>(_consts[i]) << "\"\n";
		}
		else {
			throw Error("Unvalid typeid");
		}
	}
	//start code
	_wtr << ".start:" << '\n';
	for (int i = 0; i < _startInstructions.size(); i++) {
		_wtr << i << '\t' << instructionToAssembly(_startInstructions[i]) << '\n';
	}
	//function table
	_wtr << ".functions:" << '\n';
	for (int i = 0; i < _instructions.size(); i++) {
		std::string function_name = std::any_cast<std::string>(_consts[_functionNameConstant[i]]);
		_wtr << i << '\t' << _functionNameConstant[i] << '\t' << _functionParameter[function_name].size() << "\t1\n";
	}
	//function instructions table
	for (int i = 0; i < _instructions.size(); i++) {
		_wtr << ".F" << i << ":\t#" << std::any_cast<std::string>(_consts[_functionNameConstant[i]]) << '\n';
		for (int j = 0; j < _instructions[i].size(); j++) {
			_wtr << j << '\t' << instructionToAssembly(_instructions[i][j]) << '\n';
		}
	}
}